

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O0

void __thiscall
ParsedPGTrackData::extractData(ParsedPGTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  uint16_t uVar1;
  ushort uVar2;
  uint32_t uVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  int64_t iVar6;
  uint32_t *ptsDts;
  uint8_t *puStack_48;
  uint16_t blockSize_1;
  uint8_t *dst;
  uint16_t blockSize;
  int blocks;
  uint8_t *end;
  uint8_t *curPtr;
  int size_local;
  uint8_t *buff_local;
  AVPacket *pkt_local;
  ParsedPGTrackData *this_local;
  
  puVar4 = buff + size;
  dst._4_4_ = 0;
  for (end = buff; end <= puVar4 + -3; end = end + (int)(uint)(ushort)(uVar1 + 3)) {
    uVar1 = AV_RB16(end + 1);
    if ((uint16_t)(uVar1 + 3) == 0) break;
    dst._4_4_ = dst._4_4_ + 1;
  }
  if (end == puVar4) {
    pkt->size = size + dst._4_4_ * 10;
    puVar5 = (uint8_t *)operator_new__((long)pkt->size);
    pkt->data = puVar5;
    puStack_48 = pkt->data;
    for (end = buff; end <= puVar4 + -3; end = end + (int)(uint)uVar2) {
      uVar1 = AV_RB16(end + 1);
      uVar2 = uVar1 + 3;
      *puStack_48 = 'P';
      puStack_48[1] = 'G';
      iVar6 = internalClockToPts(pkt->pts);
      uVar3 = my_ntohl((uint32_t)iVar6);
      *(uint32_t *)(puStack_48 + 2) = uVar3;
      puStack_48[6] = '\0';
      puStack_48[7] = '\0';
      puStack_48[8] = '\0';
      puStack_48[9] = '\0';
      memcpy(puStack_48 + 10,end,(ulong)uVar2);
      puStack_48 = puStack_48 + 10 + (int)(uint)uVar2;
    }
    if (puStack_48 != pkt->data + pkt->size) {
      __assert_fail("dst == pkt->data + pkt->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                    ,0x1b1,
                    "virtual void ParsedPGTrackData::extractData(AVPacket *, uint8_t *, const int)")
      ;
    }
  }
  else {
    pkt->size = 0;
    pkt->data = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void ParsedPGTrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    static constexpr int PG_HEADER_SIZE = 10;

    const uint8_t* curPtr = buff;
    const uint8_t* end = buff + size;
    int blocks = 0;
    while (curPtr <= end - 3)
    {
        const uint16_t blockSize = AV_RB16(curPtr + 1) + 3;
        if (blockSize == 0)
            break;
        curPtr += blockSize;
        blocks++;
    }
    // assert(curPtr == end);
    if (curPtr != end)
    {
        pkt->size = 0;
        pkt->data = nullptr;
        return;  // ignore invalid packet
    }

    pkt->size = size + PG_HEADER_SIZE * blocks;
    pkt->data = new uint8_t[pkt->size];
    curPtr = buff;
    uint8_t* dst = pkt->data;
    while (curPtr <= end - 3)
    {
        const uint16_t blockSize = AV_RB16(curPtr + 1) + 3;

        dst[0] = 'P';
        dst[1] = 'G';
        const auto ptsDts = reinterpret_cast<uint32_t*>(dst + 2);
        ptsDts[0] = my_htonl(static_cast<uint32_t>(internalClockToPts(pkt->pts)));
        ptsDts[1] = 0;
        dst += PG_HEADER_SIZE;
        memcpy(dst, curPtr, blockSize);
        curPtr += blockSize;
        dst += blockSize;
    }
    assert(dst == pkt->data + pkt->size);
}